

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.cpp
# Opt level: O2

void __thiscall YAML::Scanner::Scanner(Scanner *this,istream *in)

{
  YAML::Stream::Stream(&this->INPUT,in);
  std::queue<YAML::Token,std::deque<YAML::Token,std::allocator<YAML::Token>>>::
  queue<std::deque<YAML::Token,std::allocator<YAML::Token>>,void>(&this->m_tokens);
  this->m_startedStream = false;
  this->m_endedStream = false;
  this->m_simpleKeyAllowed = false;
  this->m_canBeJSONFlow = false;
  std::
  stack<YAML::Scanner::SimpleKey,std::deque<YAML::Scanner::SimpleKey,std::allocator<YAML::Scanner::SimpleKey>>>
  ::stack<std::deque<YAML::Scanner::SimpleKey,std::allocator<YAML::Scanner::SimpleKey>>,void>
            (&this->m_simpleKeys);
  std::
  stack<YAML::Scanner::IndentMarker*,std::deque<YAML::Scanner::IndentMarker*,std::allocator<YAML::Scanner::IndentMarker*>>>
  ::
  stack<std::deque<YAML::Scanner::IndentMarker*,std::allocator<YAML::Scanner::IndentMarker*>>,void>
            (&this->m_indents);
  (this->m_indentRefs).m_data.
  super__Vector_base<std::unique_ptr<YAML::Scanner::IndentMarker,_std::default_delete<YAML::Scanner::IndentMarker>_>,_std::allocator<std::unique_ptr<YAML::Scanner::IndentMarker,_std::default_delete<YAML::Scanner::IndentMarker>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_indentRefs).m_data.
  super__Vector_base<std::unique_ptr<YAML::Scanner::IndentMarker,_std::default_delete<YAML::Scanner::IndentMarker>_>,_std::allocator<std::unique_ptr<YAML::Scanner::IndentMarker,_std::default_delete<YAML::Scanner::IndentMarker>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_indentRefs).m_data.
  super__Vector_base<std::unique_ptr<YAML::Scanner::IndentMarker,_std::default_delete<YAML::Scanner::IndentMarker>_>,_std::allocator<std::unique_ptr<YAML::Scanner::IndentMarker,_std::default_delete<YAML::Scanner::IndentMarker>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  stack<YAML::Scanner::FLOW_MARKER,std::deque<YAML::Scanner::FLOW_MARKER,std::allocator<YAML::Scanner::FLOW_MARKER>>>
  ::stack<std::deque<YAML::Scanner::FLOW_MARKER,std::allocator<YAML::Scanner::FLOW_MARKER>>,void>
            (&this->m_flows);
  return;
}

Assistant:

Scanner::Scanner(std::istream& in)
    : INPUT(in),
      m_tokens{},
      m_startedStream(false),
      m_endedStream(false),
      m_simpleKeyAllowed(false),
      m_canBeJSONFlow(false),
      m_simpleKeys{},
      m_indents{},
      m_indentRefs{},
      m_flows{} {}